

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand::RenderCommand(RenderCommand *this)

{
  RenderCommand *this_local;
  
  DepthStencilParams::DepthStencilParams(&this->params);
  rr::WindowRectangle::WindowRectangle(&this->rect,0,0,0,0);
  tcu::Vector<float,_4>::Vector(&this->color);
  tcu::Vector<bool,_4>::Vector(&this->colorMask);
  return;
}

Assistant:

RenderCommand (void)
		: rect(0, 0, 0, 0)
	{
	}